

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy_testcase_api_tests.cpp
# Opt level: O1

void __thiscall
iu_EventListenerTest_x_iutest_x_FlagCheck_Test::Body
          (iu_EventListenerTest_x_iutest_x_FlagCheck_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_219;
  string local_218;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  byte local_1d8;
  AssertionHelper local_1d0;
  undefined1 local_1a0 [392];
  
  bVar1 = listener->called_OnTestCaseStart;
  local_1f0 = 0;
  local_1e8 = 0;
  local_1f8 = &local_1e8;
  local_1d8 = bVar1;
  if (bVar1 == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_218,(internal *)&local_1f8,
               (AssertionResult *)"listener->called_OnTestCaseStart","false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_218._M_dataplus._M_p,&local_219);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/legacy_testcase_api_tests.cpp"
    ;
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0xc2;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
  if (bVar1 != false) {
    local_1d8 = listener->called_OnTestCaseEnd ^ 1;
    local_1f0 = 0;
    local_1e8 = 0;
    local_1f8 = &local_1e8;
    if (listener->called_OnTestCaseEnd != false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_218,(internal *)&local_1f8,
                 (AssertionResult *)"listener->called_OnTestCaseEnd","true","false",in_R9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,local_218._M_dataplus._M_p,&local_219);
      local_1d0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/legacy_testcase_api_tests.cpp"
      ;
      local_1d0.m_part_result.super_iuCodeMessage.m_line = 0xc3;
      local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
    }
  }
  return;
}

Assistant:

IUTEST(EventListenerTest, FlagCheck)
{
    IUTEST_ASSERT_TRUE( listener->called_OnTestCaseStart );
    IUTEST_ASSERT_FALSE( listener->called_OnTestCaseEnd );
}